

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_kv_cursor_key(unqlite_kv_cursor *pCursor,void *pBuf,int *pnByte)

{
  undefined1 local_50 [8];
  SyBlob sBlob;
  int rc;
  int *pnByte_local;
  void *pBuf_local;
  unqlite_kv_cursor *pCursor_local;
  
  if (pBuf == (void *)0x0) {
    sBlob._28_4_ = (*pCursor->pStore->pIo->pMethods->xKeyLength)(pCursor,pnByte);
  }
  else {
    if (*pnByte < 0) {
      return -0x18;
    }
    SyBlobInitFromBuf((SyBlob *)local_50,pBuf,*pnByte);
    sBlob._28_4_ = (*pCursor->pStore->pIo->pMethods->xKey)(pCursor,unqliteDataConsumer,local_50);
    *pnByte = (int)sBlob.pBlob;
    SyBlobRelease((SyBlob *)local_50);
  }
  return sBlob._28_4_;
}

Assistant:

int unqlite_kv_cursor_key(unqlite_kv_cursor *pCursor,void *pBuf,int *pnByte)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	if( pBuf == 0 ){
		/* Key length only */
		rc = pCursor->pStore->pIo->pMethods->xKeyLength(pCursor,pnByte);
	}else{
		SyBlob sBlob;
		if( (*pnByte) < 0 ){
			return UNQLITE_CORRUPT;
		}
		/* Initialize the data consumer */
		SyBlobInitFromBuf(&sBlob,pBuf,(sxu32)(*pnByte));
		/* Consume the key */
		rc = pCursor->pStore->pIo->pMethods->xKey(pCursor,unqliteDataConsumer,&sBlob);
		 /* Key length */
		*pnByte = SyBlobLength(&sBlob);
		/* Cleanup */
		SyBlobRelease(&sBlob);
	}
	return rc;
}